

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O3

error_code __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::cancel
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,error_code *ec)

{
  int iVar1;
  error_category *peVar2;
  ulong uVar3;
  error_code eVar4;
  
  iVar1 = (this->impl_).implementation_.super_base_implementation_type.socket_;
  if (iVar1 == -1) {
    std::error_code::operator=(ec,bad_descriptor);
    uVar3 = (ulong)(uint)ec->_M_value;
    peVar2 = ec->_M_cat;
  }
  else {
    detail::epoll_reactor::cancel_ops
              ((((this->impl_).service_)->super_reactive_socket_service_base).reactor_,iVar1,
               &(this->impl_).implementation_.super_base_implementation_type.reactor_data_);
    peVar2 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar2;
    uVar3 = 0;
  }
  eVar4._M_cat = peVar2;
  eVar4._0_8_ = uVar3;
  return eVar4;
}

Assistant:

ASIO_SYNC_OP_VOID cancel(asio::error_code& ec)
  {
    impl_.get_service().cancel(impl_.get_implementation(), ec);
    ASIO_SYNC_OP_VOID_RETURN(ec);
  }